

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O0

ArrayPtr<const_capnp::_::RawBrandedSchema::Scope> __thiscall
capnp::SchemaLoader::Impl::copyDeduped<capnp::_::RawBrandedSchema::Scope>
          (Impl *this,ArrayPtr<const_capnp::_::RawBrandedSchema::Scope> values)

{
  size_t sVar1;
  Scope *pSVar2;
  ArrayPtr<const_unsigned_char> *this_00;
  Scope *__src;
  ArrayPtr<unsigned_char> local_88;
  ArrayPtr<const_unsigned_char> local_78;
  undefined1 local_68 [8];
  ArrayPtr<capnp::_::RawBrandedSchema::Scope> copy;
  ArrayPtr<const_unsigned_char> *dupe;
  ArrayPtr<const_unsigned_char> bytes;
  Impl *this_local;
  ArrayPtr<const_capnp::_::RawBrandedSchema::Scope> values_local;
  
  values_local.ptr = (Scope *)values.size_;
  this_local = (Impl *)values.ptr;
  sVar1 = kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>::size
                    ((ArrayPtr<const_capnp::_::RawBrandedSchema::Scope> *)&this_local);
  if (sVar1 == 0) {
    bytes.size_ = 0;
    pSVar2 = kj::implicitCast<capnp::_::RawBrandedSchema::Scope_const*,decltype(nullptr)>
                       ((void **)&bytes.size_);
    join_0x00000010_0x00000000_ = kj::arrayPtr<capnp::_::RawBrandedSchema::Scope_const>(pSVar2,0);
  }
  else {
    _dupe = kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>::asBytes
                      ((ArrayPtr<const_capnp::_::RawBrandedSchema::Scope> *)&this_local);
    copy.size_ = (size_t)kj::
                         Table<kj::ArrayPtr<unsigned_char_const>,kj::HashIndex<kj::_::HashSetCallbacks>>
                         ::find<0ul,kj::ArrayPtr<unsigned_char_const>&>
                                   ((Table<kj::ArrayPtr<unsigned_char_const>,kj::HashIndex<kj::_::HashSetCallbacks>>
                                     *)&this->dedupTable,(ArrayPtr<const_unsigned_char> *)&dupe);
    this_00 = kj::_::readMaybe<kj::ArrayPtr<unsigned_char_const>>
                        ((Maybe<kj::ArrayPtr<const_unsigned_char>_&> *)&copy.size_);
    if (this_00 == (ArrayPtr<const_unsigned_char> *)0x0) {
      sVar1 = kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>::size
                        ((ArrayPtr<const_capnp::_::RawBrandedSchema::Scope> *)&this_local);
      _local_68 = kj::Arena::allocateArray<capnp::_::RawBrandedSchema::Scope>(&this->arena,sVar1);
      pSVar2 = kj::ArrayPtr<capnp::_::RawBrandedSchema::Scope>::begin
                         ((ArrayPtr<capnp::_::RawBrandedSchema::Scope> *)local_68);
      __src = kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>::begin
                        ((ArrayPtr<const_capnp::_::RawBrandedSchema::Scope> *)&this_local);
      sVar1 = kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>::size
                        ((ArrayPtr<const_capnp::_::RawBrandedSchema::Scope> *)&this_local);
      memcpy(pSVar2,__src,sVar1 * 0x18);
      local_88 = kj::ArrayPtr<capnp::_::RawBrandedSchema::Scope>::asBytes
                           ((ArrayPtr<capnp::_::RawBrandedSchema::Scope> *)local_68);
      local_78 = kj::ArrayPtr::operator_cast_to_ArrayPtr((ArrayPtr *)&local_88);
      kj::Table<kj::ArrayPtr<const_unsigned_char>,_kj::HashIndex<kj::_::HashSetCallbacks>_>::insert
                (&(this->dedupTable).
                  super_Table<kj::ArrayPtr<const_unsigned_char>,_kj::HashIndex<kj::_::HashSetCallbacks>_>
                 ,&local_78);
      join_0x00000010_0x00000000_ = kj::ArrayPtr::operator_cast_to_ArrayPtr((ArrayPtr *)local_68);
    }
    else {
      pSVar2 = (Scope *)kj::ArrayPtr<const_unsigned_char>::begin(this_00);
      sVar1 = kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>::size
                        ((ArrayPtr<const_capnp::_::RawBrandedSchema::Scope> *)&this_local);
      join_0x00000010_0x00000000_ =
           kj::arrayPtr<capnp::_::RawBrandedSchema::Scope_const>(pSVar2,sVar1);
    }
  }
  return stack0xffffffffffffffe8;
}

Assistant:

kj::ArrayPtr<const T> SchemaLoader::Impl::copyDeduped(kj::ArrayPtr<const T> values) {
  if (values.size() == 0) {
    return kj::arrayPtr(kj::implicitCast<const T*>(nullptr), 0);
  }

  auto bytes = values.asBytes();

  KJ_IF_MAYBE(dupe, dedupTable.find(bytes)) {
    return kj::arrayPtr(reinterpret_cast<const T*>(dupe->begin()), values.size());
  }

  // Need to make a new copy.
  auto copy = arena.allocateArray<T>(values.size());
  memcpy(copy.begin(), values.begin(), values.size() * sizeof(T));

  dedupTable.insert(copy.asBytes());

  return copy;
}